

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  Coroutine<bool> *this_00;
  Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *this_01;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  HttpInputStreamImpl *this_02;
  long lVar1;
  SourceLocation location;
  bool bVar2;
  coroutine_handle<void> handle;
  long in_RSI;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_03;
  char *local_50;
  char *pcStack_48;
  _func_int **local_40;
  PromiseBase local_38;
  
  handle._M_fr_ptr = operator_new(0x628);
  *(code **)handle._M_fr_ptr = awaitNextMessage;
  *(code **)((long)handle._M_fr_ptr + 8) = awaitNextMessage;
  this_00 = (Coroutine<bool> *)((long)handle._M_fr_ptr + 0x10);
  *(long *)((long)handle._M_fr_ptr + 0x610) = in_RSI;
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  pcStack_48 = "awaitNextMessage";
  local_40 = (_func_int **)0x15000005d2;
  location.function = "awaitNextMessage";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x5d2;
  location.columnNumber = 0x15;
  kj::_::Coroutine<bool>::Coroutine(this_00,handle,location);
  local_38.node.ptr = (OwnPromiseNode)(OwnPromiseNode)this;
  kj::_::Coroutine<bool>::get_return_object((Coroutine<bool> *)this);
  if (*(char *)(in_RSI + 0xa8) == '\0') {
    if (*(long *)(in_RSI + 0xe0) != 0) {
      this_01 = (Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t> *)((long)handle._M_fr_ptr + 0x5f8)
      ;
      *(char **)((long)handle._M_fr_ptr + 0x5e0) =
           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
      ;
      *(char **)((long)handle._M_fr_ptr + 0x5e8) = "awaitNextMessage";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x5f0) = 0x13000005e1;
      Promise<void>::fork((Promise<void> *)this_01);
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffb0);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(in_RSI + 0xe8),
                 (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffb0);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&stack0xffffffffffffffb0);
      kj::_::ForkedPromiseAwaiter<void>::ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238),
                 (ForkedPromise<void> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 0;
      this = (HttpInputStreamImpl *)((long)handle._M_fr_ptr + 0x268);
      bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)this,(CoroutineBase *)this_00);
      if (bVar2) {
        return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
      }
      kj::_::PromiseAwaiter<void>::await_resume((PromiseAwaiter<void> *)this);
      kj::_::ForkedPromiseAwaiter<void>::~ForkedPromiseAwaiter
                ((ForkedPromiseAwaiter<void> *)((long)handle._M_fr_ptr + 0x238));
      Own<kj::_::ForkHub<kj::_::Void>,_std::nullptr_t>::dispose(this_01);
    }
    __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x420);
    this_03 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x608);
    while( true ) {
      *(HttpInputStreamImpl **)((long)handle._M_fr_ptr + 0x618) = this;
      this_02 = *(HttpInputStreamImpl **)((long)handle._M_fr_ptr + 0x610);
      snarfBufferedLineBreak(this_02);
      if ((this_02->lineBreakBeforeNextHeader == false) && ((this_02->leftover).size_ != 0))
      goto LAB_0030d6f8;
      lVar1 = *(long *)((long)handle._M_fr_ptr + 0x610);
      (**(code **)(**(long **)(lVar1 + 0x10) + 8))
                (this_03,*(long **)(lVar1 + 0x10),*(undefined8 *)(lVar1 + 0x18),1,
                 *(undefined8 *)(lVar1 + 0x20));
      co_await<unsigned_long>(__return_storage_ptr__,(Promise<unsigned_long> *)this_03);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 1;
      bVar2 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                        ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar2) {
        return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
      }
      this = (HttpInputStreamImpl *)
             kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr__);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_03);
      if ((PromiseAwaiter<void> *)this == (PromiseAwaiter<void> *)0x0) break;
      lVar1 = *(long *)((long)handle._M_fr_ptr + 0x610);
      *(undefined8 *)(lVar1 + 0x38) = *(undefined8 *)(lVar1 + 0x18);
      *(HttpInputStreamImpl **)(lVar1 + 0x40) = this;
    }
    kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
              ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,false);
  }
  else {
LAB_0030d6f8:
    kj::_::CoroutineMixin<kj::_::Coroutine<bool>,_bool>::return_value
              ((CoroutineMixin<kj::_::Coroutine<bool>,_bool> *)this_00,true);
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x620) = 2;
  return (Promise<bool>)(PromiseNode *)local_38.node.ptr;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (resumingRequest != kj::none) {
      // We're resuming a request, so report that we have a message.
      co_return true;
    }

    if (onMessageDone != kj::none) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      co_await fork;
    }

    for (;;) {
      snarfBufferedLineBreak();

      if (!lineBreakBeforeNextHeader && leftover != nullptr) {
        co_return true;
      }

      auto amount = co_await inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size());
      if (amount == 0) {
        co_return false;
      }

      leftover = headerBuffer.first(amount);
    }
  }